

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan-c.cpp
# Opt level: O1

void duckdb_add_replacement_scan
               (duckdb_database db,duckdb_replacement_callback_t replacement,void *extra_data,
               duckdb_delete_callback_t delete_callback)

{
  pointer pCVar1;
  DuckDB *this;
  type db_00;
  DBConfig *pDVar2;
  pointer *__ptr;
  templated_unique_single_t scan_info;
  _Head_base<0UL,_duckdb::CAPIReplacementScanData_*,_false> local_38;
  ReplacementScan local_30;
  
  if (replacement != (duckdb_replacement_callback_t)0x0 && db != (duckdb_database)0x0) {
    local_38._M_head_impl = (CAPIReplacementScanData *)operator_new(0x20);
    ((local_38._M_head_impl)->super_ReplacementScanData)._vptr_ReplacementScanData =
         (_func_int **)0x0;
    (local_38._M_head_impl)->callback = (duckdb_replacement_callback_t)0x0;
    (local_38._M_head_impl)->extra_data = (void *)0x0;
    (local_38._M_head_impl)->delete_callback = (duckdb_delete_callback_t)0x0;
    ((local_38._M_head_impl)->super_ReplacementScanData)._vptr_ReplacementScanData =
         (_func_int **)&PTR__CAPIReplacementScanData_019c93b0;
    pCVar1 = duckdb::
             unique_ptr<duckdb::CAPIReplacementScanData,_std::default_delete<duckdb::CAPIReplacementScanData>,_true>
             ::operator->((unique_ptr<duckdb::CAPIReplacementScanData,_std::default_delete<duckdb::CAPIReplacementScanData>,_true>
                           *)&local_38);
    pCVar1->callback = replacement;
    pCVar1 = duckdb::
             unique_ptr<duckdb::CAPIReplacementScanData,_std::default_delete<duckdb::CAPIReplacementScanData>,_true>
             ::operator->((unique_ptr<duckdb::CAPIReplacementScanData,_std::default_delete<duckdb::CAPIReplacementScanData>,_true>
                           *)&local_38);
    pCVar1->extra_data = extra_data;
    pCVar1 = duckdb::
             unique_ptr<duckdb::CAPIReplacementScanData,_std::default_delete<duckdb::CAPIReplacementScanData>,_true>
             ::operator->((unique_ptr<duckdb::CAPIReplacementScanData,_std::default_delete<duckdb::CAPIReplacementScanData>,_true>
                           *)&local_38);
    pCVar1->delete_callback = delete_callback;
    this = duckdb::shared_ptr<duckdb::DuckDB,_true>::operator->
                     ((shared_ptr<duckdb::DuckDB,_true> *)db);
    db_00 = duckdb::shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&this->instance);
    pDVar2 = duckdb::DBConfig::GetConfig(db_00);
    local_30.data.
    super_unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ReplacementScanData_*,_std::default_delete<duckdb::ReplacementScanData>_>
    .super__Head_base<0UL,_duckdb::ReplacementScanData_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
         )(unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
           )local_38._M_head_impl;
    local_38._M_head_impl = (CAPIReplacementScanData *)0x0;
    local_30.function = duckdb::duckdb_capi_replacement_callback;
    std::vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>::
    emplace_back<duckdb::ReplacementScan>
              (&(pDVar2->replacement_scans).
                super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>,
               &local_30);
    if (local_30.data.
        super_unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ReplacementScanData_*,_std::default_delete<duckdb::ReplacementScanData>_>
        .super__Head_base<0UL,_duckdb::ReplacementScanData_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>,_true,_true>
         )0x0) {
      (*((ReplacementScanData *)
        local_30.data.
        super_unique_ptr<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ReplacementScanData,_std::default_delete<duckdb::ReplacementScanData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ReplacementScanData_*,_std::default_delete<duckdb::ReplacementScanData>_>
        .super__Head_base<0UL,_duckdb::ReplacementScanData_*,_false>._M_head_impl)->
        _vptr_ReplacementScanData[1])();
    }
    if (local_38._M_head_impl != (CAPIReplacementScanData *)0x0) {
      (*((local_38._M_head_impl)->super_ReplacementScanData)._vptr_ReplacementScanData[1])();
    }
  }
  return;
}

Assistant:

void duckdb_add_replacement_scan(duckdb_database db, duckdb_replacement_callback_t replacement, void *extra_data,
                                 duckdb_delete_callback_t delete_callback) {
	if (!db || !replacement) {
		return;
	}
	auto wrapper = reinterpret_cast<duckdb::DatabaseWrapper *>(db);
	auto scan_info = duckdb::make_uniq<duckdb::CAPIReplacementScanData>();
	scan_info->callback = replacement;
	scan_info->extra_data = extra_data;
	scan_info->delete_callback = delete_callback;

	auto &config = duckdb::DBConfig::GetConfig(*wrapper->database->instance);
	config.replacement_scans.push_back(
	    duckdb::ReplacementScan(duckdb::duckdb_capi_replacement_callback, std::move(scan_info)));
}